

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::LocationAttributeTest::iterate(LocationAttributeTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  string local_108;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  Cond local_d0;
  Attribute local_a8;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"a_0","");
  paVar1 = &local_d0.m_name.field_2;
  local_d0.m_negate = true;
  local_d0.m_name.field_2._M_allocated_capacity = 0x737961776c615f5f;
  local_d0.m_name.field_2._8_2_ = 0x5f5f;
  local_d0.m_name._M_string_length = 10;
  local_d0.m_name.field_2._M_local_buf[10] = '\0';
  local_d0.m_name._M_dataplus._M_p = (pointer)paVar1;
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_a8,&this->m_type,&local_108,3,&local_d0,this->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_cond.m_name._M_dataplus._M_p != &local_a8.m_cond.m_name.field_2) {
    operator_delete(local_a8.m_cond.m_name._M_dataplus._M_p,
                    local_a8.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_name._M_dataplus._M_p != &local_a8.m_name.field_2) {
    operator_delete(local_a8.m_name._M_dataplus._M_p,
                    local_a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_type.m_name._M_dataplus._M_p != &local_a8.m_type.m_name.field_2) {
    operator_delete(local_a8.m_type.m_name._M_dataplus._M_p,
                    local_a8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_name._M_dataplus._M_p,
                    local_d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_type.m_name._M_dataplus._M_p = (pointer)0x0;
  local_a8.m_type.m_name._M_string_length = 0;
  local_a8.m_type.m_name.field_2._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&noBindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&local_a8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&local_a8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult LocationAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;

	vector<Attribute>	attributes;

	attributes.push_back(Attribute(m_type, "a_0", 3, Cond::COND_ALWAYS, m_arraySize));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, noBindings, noBindings, false);
	return STOP;
}